

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcCallFunction(NULLCFuncPtr ptr,...)

{
  char in_AL;
  bool bVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint functionID;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  char *local_50;
  char *argBuf;
  va_list args;
  NULLCFuncPtr ptr_local;
  
  functionID = ptr.id;
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    ptr_local.context._7_1_ = '\0';
  }
  else {
    args[0].overflow_arg_area = local_108;
    args[0]._0_8_ = &stack0x00000008;
    argBuf._4_4_ = 0x30;
    argBuf._0_4_ = 0x10;
    local_f8 = in_RDX;
    local_f0 = in_RCX;
    local_e8 = in_R8;
    local_e0 = in_R9;
    local_50 = nullcGetArgumentVector(functionID,(uintptr_t)ptr.context,(__va_list_tag *)&argBuf);
    if (local_50 == (char *)0x0) {
      ptr_local.context._7_1_ = '\0';
    }
    else {
      if (NULLC::currExec == 1) {
        bVar1 = ExecutorX86::Run(NULLC::executorX86,functionID,local_50);
        if (!bVar1) {
          NULLC::nullcLastError = ExecutorX86::GetErrorMessage(NULLC::executorX86);
          return '\0';
        }
      }
      else if (((NULLC::currExec != 2) && (NULLC::currExec == 0)) &&
              (bVar1 = ExecutorRegVm::Run(NULLC::executorRegVm,functionID,local_50), !bVar1)) {
        NULLC::nullcLastError = ExecutorRegVm::GetErrorMessage(NULLC::executorRegVm);
        return '\0';
      }
      ptr_local.context._7_1_ = '\x01';
    }
  }
  return ptr_local.context._7_1_;
}

Assistant:

nullres nullcCallFunction(NULLCFuncPtr ptr, ...)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	// Copy arguments in argument buffer
	va_list args;

	va_start(args, ptr);
	const char *argBuf = nullcGetArgumentVector(ptr.id, (uintptr_t)ptr.context, args);
	va_end(args);

	if(!argBuf)
		return false;
	
	if(currExec == NULLC_X86)
	{
#ifdef NULLC_BUILD_X86_JIT
		if(!executorX86->Run(ptr.id, argBuf))
		{
			nullcLastError = executorX86->GetErrorMessage();

			return false;
		}
#endif
	}
	else if(currExec == NULLC_LLVM)
	{
#ifdef NULLC_LLVM_SUPPORT
		if(!executorLLVM->Run(ptr.id, argBuf))
		{
			nullcLastError = executorLLVM->GetErrorMessage();

			return false;
		}
#endif
	}
	else if(currExec == NULLC_REG_VM)
	{
		if(!executorRegVm->Run(ptr.id, argBuf))
		{
			nullcLastError = executorRegVm->GetErrorMessage();

			return false;
		}
	}

	return true;
}